

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

size_t __thiscall slang::SourceManager::getColumnNumber(SourceManager *this,SourceLocation location)

{
  char cVar1;
  FileData *pFVar2;
  pointer pcVar3;
  long lVar4;
  FileInfo *pFVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  
  pFVar5 = getFileInfo(this,(BufferID)(location._0_4_ & 0xfffffff));
  if ((pFVar5 == (FileInfo *)0x0) || (pFVar2 = pFVar5->data, pFVar2 == (FileData *)0x0)) {
    sVar6 = 0;
  }
  else {
    uVar8 = (ulong)location >> 0x1c;
    pcVar3 = (pFVar2->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(pFVar2->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pcVar3) <= uVar8) {
      assert::assertFailed
                ("lineStart < fd->mem.size()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/text/SourceManager.cpp"
                 ,0x40,"size_t slang::SourceManager::getColumnNumber(SourceLocation) const");
    }
    lVar4 = 0;
    do {
      lVar7 = lVar4;
      if ((-lVar7 == uVar8) || (cVar1 = pcVar3[lVar7 + uVar8 + -1], cVar1 == '\r')) break;
      lVar4 = lVar7 + -1;
    } while (cVar1 != '\n');
    sVar6 = 1 - lVar7;
  }
  return sVar6;
}

Assistant:

size_t SourceManager::getColumnNumber(SourceLocation location) const {
    auto info = getFileInfo(location.buffer());

    // LOCKING: don't need a lock here, data is always valid once loaded.
    if (!info || !info->data)
        return 0;

    // walk backward to find start of line
    auto fd = info->data;
    size_t lineStart = location.offset();
    ASSERT(lineStart < fd->mem.size());
    while (lineStart > 0 && fd->mem[lineStart - 1] != '\n' && fd->mem[lineStart - 1] != '\r')
        lineStart--;

    return location.offset() - lineStart + 1;
}